

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_FraigSelectBestPat(Ivy_FraigMan_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  if (0 < p->nSimWords) {
    uVar5 = p->nSimWords * 0x20;
    uVar4 = 2;
    if (2 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    uVar9 = 0xffffffff;
    uVar6 = 1;
    iVar8 = 0;
    do {
      iVar1 = p->pPatScores[uVar6];
      iVar7 = iVar1;
      if (iVar1 < iVar8) {
        iVar7 = iVar8;
      }
      if (iVar8 < iVar1) {
        uVar9 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
      iVar8 = iVar7;
    } while (uVar4 != uVar6);
    if (iVar7 != 0) {
      memset(p->pPatWords,0,(long)p->nPatWords << 2);
      pVVar2 = p->pManAig->vPis;
      iVar8 = pVVar2->nSize;
      if (iVar8 < 1) {
        return iVar7;
      }
      ppvVar3 = pVVar2->pArray;
      uVar4 = 0;
      do {
        if ((*(uint *)(*(long *)((long)ppvVar3[uVar4] + 0x20) + 0x20 + (long)((int)uVar9 >> 5) * 4)
            & 1 << ((byte)uVar9 & 0x1f)) != 0) {
          p->pPatWords[uVar4 >> 5 & 0x7ffffff] =
               p->pPatWords[uVar4 >> 5 & 0x7ffffff] | 1 << ((byte)uVar4 & 0x1f);
          iVar8 = pVVar2->nSize;
        }
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)iVar8);
      return iVar7;
    }
  }
  return 0;
}

Assistant:

int Ivy_FraigSelectBestPat( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, nLimit = p->nSimWords * 32, MaxScore = 0, BestPat = -1;
    for ( i = 1; i < nLimit; i++ )
    {
        if ( MaxScore < p->pPatScores[i] )
        {
            MaxScore = p->pPatScores[i];
            BestPat = i;
        }
    }
    if ( MaxScore == 0 )
        return 0;
//    if ( MaxScore > p->pParams->MaxScore )
//    printf( "Max score is %3d.  ", MaxScore );
    // copy the best pattern into the selected pattern
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pSims = Ivy_ObjSim(pObj);
        if ( Ivy_InfoHasBit(pSims->pData, BestPat) )
            Ivy_InfoSetBit(p->pPatWords, i);
    }
    return MaxScore;
}